

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence_lanscapes_on_grid_test.cpp
# Opt level: O2

void __thiscall
check_construction_of_landscape_using_only_ten_levels::test_method
          (check_construction_of_landscape_using_only_ten_levels *this)

{
  long lVar1;
  size_t i;
  long lVar2;
  vector<double,_std::allocator<double>_> v2;
  vector<double,_std::allocator<double>_> v1;
  undefined1 local_118 [8];
  undefined8 local_110;
  shared_count sStack_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined **local_c0;
  undefined1 local_b8;
  undefined8 *local_b0;
  char **local_a8;
  Persistence_landscape_on_grid g;
  Persistence_landscape_on_grid l;
  
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            (&l,"data/file_with_diagram_1",100,10,0xffff);
  Gudhi::Persistence_representations::Persistence_landscape_on_grid::Persistence_landscape_on_grid
            (&g,"data/file_with_diagram_1",100,0xffff);
  for (lVar1 = 0; lVar1 != 10; lVar1 = lVar1 + 1) {
    Gudhi::Persistence_representations::Persistence_landscape_on_grid::vectorize
              ((vector<double,_std::allocator<double>_> *)
               &v1.super__Vector_base<double,_std::allocator<double>_>,&l,(int)lVar1);
    Gudhi::Persistence_representations::Persistence_landscape_on_grid::vectorize(&v2,&g,(int)lVar1);
    local_d0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
    ;
    local_c8 = "";
    local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x2d,&local_e0);
    local_118[0] = (long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start ==
                   (long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
    local_110 = 0;
    sStack_108.pi_ = (sp_counted_base *)0x0;
    local_f0 = "v1.size() == v2.size()";
    local_e8 = "";
    local_b8 = 0;
    local_c0 = &PTR__lazy_ostream_00112d40;
    local_b0 = &boost::unit_test::lazy_ostream::inst;
    local_a8 = &local_f0;
    local_100 = 
    "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_representations/test/persistence_lanscapes_on_grid_test.cpp"
    ;
    local_f8 = "";
    boost::test_tools::tt_detail::report_assertion(local_118,&local_c0,&local_100,0x2d,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_108);
    for (lVar2 = 0;
        lVar2 != (long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3; lVar2 = lVar2 + 1) {
      GUDHI_TEST_FLOAT_EQUALITY_CHECK<double>
                (v1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar2],
                 v2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar2],2.220446049250313e-16);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&v2.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&v1.super__Vector_base<double,_std::allocator<double>_>);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&g.values_of_landscapes);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&l.values_of_landscapes);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(check_construction_of_landscape_using_only_ten_levels) {
  // TODO
  unsigned number = 10;
  Persistence_landscape_on_grid l("data/file_with_diagram_1", 100, number);
  Persistence_landscape_on_grid g("data/file_with_diagram_1", 100, std::numeric_limits<unsigned short>::max());
  // cut all the elements of order > 10 in g.

  for (size_t level = 0; level != number; ++level) {
    std::vector<double> v1 = l.vectorize(level);
    std::vector<double> v2 = g.vectorize(level);
    BOOST_CHECK(v1.size() == v2.size());
    for (size_t i = 0; i != v1.size(); ++i) {
      GUDHI_TEST_FLOAT_EQUALITY_CHECK(v1[i], v2[i]);
    }
  }
}